

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

void rr::anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               VertexPacket **vertices,size_t numVertices,VertexPacketAllocator *vpalloc)

{
  size_type __n;
  VertexPacketAllocator *vpalloc_00;
  vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> inputPrimitives;
  allocator_type local_51;
  Program *local_50;
  _Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_> local_48;
  
  __n = 0;
  if (1 < numVertices) {
    __n = numVertices - 1;
  }
  vpalloc_00 = (VertexPacketAllocator *)numVertices;
  local_50 = program;
  std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::vector
            ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_48,__n,&local_51);
  pa::LineStrip::
  exec<__gnu_cxx::__normal_iterator<rr::pa::Line*,std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>>
            ((__normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
              )local_48._M_impl.super__Vector_impl_data._M_start,vertices,numVertices,
             state->provokingVertexConvention);
  rr::(anonymous_namespace)::
  makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
            ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_48,vpalloc);
  rr::(anonymous_namespace)::
  drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
            (state,renderTarget,local_50,
             (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_48,vpalloc_00);
  std::_Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void drawGeometryShaderOutputAsPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, VertexPacket* const* vertices, size_t numVertices, VertexPacketAllocator& vpalloc)
{
	// Run primitive assembly for generated stream

	const size_t															assemblerPrimitiveCount		= PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::getPrimitiveCount(numVertices);
	std::vector<typename PrimitiveTypeTraits<DrawPrimitiveType>::BaseType>	inputPrimitives				(assemblerPrimitiveCount);

	PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::exec(inputPrimitives.begin(), vertices, numVertices, state.provokingVertexConvention); // \note input Primitives are baseType_t => only basic primitives (non adjacency) will compile

	// Make shared vertices distinct

	makeSharedVerticesDistinct(inputPrimitives, vpalloc);

	// Draw assembled primitives

	drawBasicPrimitives(state, renderTarget, program, inputPrimitives, vpalloc);
}